

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

void __thiscall
rr::MultiSampleLineRasterizer::rasterize
          (MultiSampleLineRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float fVar1;
  undefined4 uVar2;
  uint uVar3;
  uint in_EAX;
  ulong uVar4;
  ulong uVar5;
  float *depthValues_00;
  Vec4 *pVVar6;
  long lVar7;
  uint uStack_38;
  int numPacketsRasterized2;
  
  uStack_38 = in_EAX;
  TriangleRasterizer::rasterize
            (&this->m_triangleRasterizer0,fragmentPackets,depthValues,maxFragmentPackets,
             numPacketsRasterized);
  uVar3 = *numPacketsRasterized;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  pVVar6 = fragmentPackets->barycentric + 2;
  for (; lVar7 = -0x10, uVar4 != uVar5; uVar4 = uVar4 + 1) {
    for (; lVar7 != 0; lVar7 = lVar7 + 4) {
      fVar1 = *(float *)((long)(pVVar6 + 1) + lVar7);
      *(undefined4 *)((long)(pVVar6 + 1) + lVar7) = 0;
      *(float *)((long)pVVar6->m_data + lVar7) = fVar1 + *(float *)((long)pVVar6->m_data + lVar7);
    }
    pVVar6 = pVVar6 + 4;
  }
  if (maxFragmentPackets != uVar3) {
    depthValues_00 = depthValues + (int)(this->m_numSamples * uVar3 * 4);
    if (depthValues == (float *)0x0) {
      depthValues_00 = (float *)0x0;
    }
    _uStack_38 = (ulong)uStack_38;
    TriangleRasterizer::rasterize
              (&this->m_triangleRasterizer1,fragmentPackets + (int)uVar3,depthValues_00,
               maxFragmentPackets - uVar3,&numPacketsRasterized2);
    *numPacketsRasterized = *numPacketsRasterized + numPacketsRasterized2;
    uVar5 = 0;
    uVar4 = (ulong)(uint)numPacketsRasterized2;
    if (numPacketsRasterized2 < 1) {
      uVar4 = uVar5;
    }
    pVVar6 = fragmentPackets[(int)uVar3].barycentric + 2;
    for (; lVar7 = -0x10, uVar5 != uVar4; uVar5 = uVar5 + 1) {
      for (; lVar7 != 0; lVar7 = lVar7 + 4) {
        uVar2 = *(undefined4 *)((long)pVVar6[-1].m_data + lVar7);
        fVar1 = *(float *)((long)(pVVar6 + 1) + lVar7);
        *(undefined4 *)((long)(pVVar6 + 1) + lVar7) = 0;
        *(float *)((long)pVVar6[-1].m_data + lVar7) =
             fVar1 + *(float *)((long)pVVar6->m_data + lVar7);
        *(undefined4 *)((long)pVVar6->m_data + lVar7) = uVar2;
      }
      pVVar6 = pVVar6 + 4;
    }
  }
  return;
}

Assistant:

void MultiSampleLineRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	m_triangleRasterizer0.rasterize(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);

	// Remove 3rd barycentric value and rebalance. Lines do not have non-zero barycentric at index 2
	for (int packNdx = 0; packNdx < numPacketsRasterized; ++packNdx)
	for (int fragNdx = 0; fragNdx < 4; fragNdx++)
	{
		float removedValue = fragmentPackets[packNdx].barycentric[2][fragNdx];
		fragmentPackets[packNdx].barycentric[2][fragNdx] = 0.0f;
		fragmentPackets[packNdx].barycentric[1][fragNdx] += removedValue;
	}

	// rasterizer 0 filled the whole buffer?
	if (numPacketsRasterized == maxFragmentPackets)
		return;

	{
		FragmentPacket* const nextFragmentPackets	= fragmentPackets + numPacketsRasterized;
		float* nextDepthValues						= (depthValues) ? (depthValues+4*numPacketsRasterized*m_numSamples) : (DE_NULL);
		int numPacketsRasterized2					= 0;

		m_triangleRasterizer1.rasterize(nextFragmentPackets, nextDepthValues, maxFragmentPackets - numPacketsRasterized, numPacketsRasterized2);

		numPacketsRasterized += numPacketsRasterized2;

		// Fix swapped barycentrics in the second triangle
		for (int packNdx = 0; packNdx < numPacketsRasterized2; ++packNdx)
		for (int fragNdx = 0; fragNdx < 4; fragNdx++)
		{
			float removedValue = nextFragmentPackets[packNdx].barycentric[2][fragNdx];
			nextFragmentPackets[packNdx].barycentric[2][fragNdx] = 0.0f;
			nextFragmentPackets[packNdx].barycentric[1][fragNdx] += removedValue;

			// edge has reversed direction
			std::swap(nextFragmentPackets[packNdx].barycentric[0][fragNdx], nextFragmentPackets[packNdx].barycentric[1][fragNdx]);
		}
	}
}